

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

void menu_bar_inter_abort_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object menu_bar_win;
  Am_Object obj;
  Am_Object sub_window;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  obj.data = (Am_Object_Data *)0x0;
  menu_bar_win.data = (Am_Object_Data *)0x0;
  sub_window.data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)inter);
  pAVar2 = Am_Object::Get(&local_20,0x68,0);
  Am_Object::operator=(&menu_bar_win,pAVar2);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(inter,0x16b,0);
  Am_Object::operator=(&obj,pAVar2);
  Am_Object::Am_Object(&local_28,&obj);
  Am_Object::Am_Object(&local_30,&menu_bar_win);
  clear_interim_sel(&local_10,&local_28);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  pAVar2 = Am_Object::Get(inter,0x16a,0);
  Am_Object::operator=(&obj,pAVar2);
  Am_Object::Am_Object(&local_38,&obj);
  Am_Object::Am_Object(&local_40,&menu_bar_win);
  clear_interim_sel(&local_18,&local_38);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_38);
  pAVar2 = Am_Object::Get(inter,0x1d2,0);
  Am_Object::operator=(&sub_window,pAVar2);
  bVar1 = Am_Object::Valid(&sub_window);
  if (bVar1) {
    set_sub_window_vis(&sub_window,false,&menu_bar_win);
  }
  value = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
  Am_Object::Set(inter,0x1d2,value,1);
  Am_Object::~Am_Object(&sub_window);
  Am_Object::~Am_Object(&menu_bar_win);
  Am_Object::~Am_Object(&obj);
  return;
}

Assistant:

Am_Define_Object_Formula(popup_sub_win_undo_handler)
{
  Am_Object for_item, main_window, undo_handler;
  for_item = self.Get(Am_FOR_ITEM);
  if (for_item.Valid()) {
    Am_Value v;
    v = for_item.Peek(Am_WINDOW);
    if (v.Valid()) {
      main_window = v;
      if (main_window.Valid()) {
        v = main_window.Peek(Am_UNDO_HANDLER);
        if (v.Valid())
          undo_handler = v;
      }
    }
  }
  return undo_handler;
}